

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O2

int __thiscall QWizard::nextId(QWizard *this)

{
  int iVar1;
  QWizardPage *pQVar2;
  
  pQVar2 = currentPage(this);
  if (pQVar2 != (QWizardPage *)0x0) {
    iVar1 = (**(code **)(*(long *)&pQVar2->super_QWidget + 0x1c0))(pQVar2);
    return iVar1;
  }
  return -1;
}

Assistant:

int QWizard::nextId() const
{
    const QWizardPage *page = currentPage();
    if (!page)
        return -1;

    return page->nextId();
}